

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_skip(gz_statep state,long len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (len != 0) {
    do {
      uVar1 = state->have;
      if ((ulong)uVar1 == 0) {
        if ((state->eof != 0) && ((state->strm).avail_in == 0)) {
          return 0;
        }
        iVar2 = gz_make(state);
        if (iVar2 == -1) {
          return -1;
        }
      }
      else {
        uVar3 = len & 0xffffffff;
        if ((long)(ulong)uVar1 <= len) {
          uVar3 = (ulong)uVar1;
        }
        state->have = uVar1 - (int)uVar3;
        state->next = state->next + uVar3;
        state->pos = state->pos + uVar3;
        len = len - uVar3;
      }
    } while (len != 0);
  }
  return 0;
}

Assistant:

local int gz_skip(gz_statep state, z_off64_t len)
{
    unsigned n;

    /* skip over len bytes or reach end-of-file, whichever comes first */
    while (len)
        /* skip over whatever is in output buffer */
        if (state->have) {
            n = GT_OFF(state->have) || (z_off64_t)state->have > len ?
                (unsigned)len : state->have;
            state->have -= n;
            state->next += n;
            state->pos += n;
            len -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0)
            break;

        /* need more data to skip -- load up output buffer */
        else {
            /* get more output, looking for header if required */
            if (gz_make(state) == -1)
                return -1;
        }
    return 0;
}